

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::markDirty<QRegion>
          (QWidgetRepaintManager *this,QRegion *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  QWidgetRepaintManager *this_00;
  QWidgetRepaintManager QVar1;
  uint uVar2;
  QWidgetPrivate *this_01;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  char cVar6;
  byte bVar7;
  QLoggingCategory *pQVar8;
  QDebug *pQVar9;
  QSize QVar10;
  QRegion *this_02;
  long in_FS_OFFSET;
  QRect QVar11;
  QRect local_c0;
  QRect local_b0;
  QRect local_a0;
  QPoint local_90;
  QRect local_88;
  QRect local_78;
  undefined4 uStack_68;
  undefined4 local_64;
  char *local_60;
  QRegion local_58;
  QDebug local_50;
  QDebug local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar8->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_60 = pQVar8->name;
    local_78.x1.m_i = 2;
    local_78.y1.m_i = 0;
    local_78.x2.m_i = 0;
    local_78.y2.m_i = 0;
    uStack_68 = 0;
    local_64 = 0;
    QMessageLogger::info();
    pQVar9 = QDebug::operator<<((QDebug *)&local_b0,"Marking");
    local_58.d = (QRegionData *)pQVar9->stream;
    *(int *)((Stream *)local_58.d + 0x28) = *(int *)((Stream *)local_58.d + 0x28) + 1;
    ::operator<<((Stream *)&local_a0,&local_58);
    pQVar9 = QDebug::operator<<((QDebug *)&local_a0,"of");
    local_50.stream = pQVar9->stream;
    *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_88,(QWidget *)&local_50);
    pQVar9 = QDebug::operator<<((QDebug *)&local_88,"dirty");
    pQVar9 = QDebug::operator<<(pQVar9,"with");
    local_48.stream = pQVar9->stream;
    *(int *)(local_48.stream + 0x28) = *(int *)(local_48.stream + 0x28) + 1;
    ::operator<<((Stream *)local_40,(UpdateTime)&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug((QDebug *)&local_88);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug((QDebug *)&local_a0);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug((QDebug *)&local_b0);
  }
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(*(QWidgetPrivate **)&widget->field_0x8);
  local_78.x1.m_i = -0x55555556;
  local_78.y1.m_i = -0x55555556;
  local_78.x2.m_i = -0x55555556;
  local_78.y2.m_i = -0x55555556;
  QVar11 = QWidget::rect(widget);
  local_78.x1 = QVar11.x1.m_i;
  local_78.y1 = QVar11.y1.m_i;
  local_78.x2 = QVar11.x2.m_i;
  local_78.y2 = QVar11.y2.m_i;
  bVar5 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
  if (bVar5) {
    cVar6 = QRegion::isEmpty();
    this_02 = (QRegion *)(*(long *)&widget->field_0x8 + 0xe0);
    if (cVar6 == '\0') {
      cVar6 = qt_region_strictContains(this_02,&local_78);
      if (cVar6 == '\0') {
        cVar6 = QRegion::isEmpty();
        QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),r);
        if ((updateTime != UpdateNow) && (cVar6 == '\0')) goto LAB_00310635;
      }
      else {
        if (updateTime != UpdateNow) goto LAB_00310635;
        updateTime = UpdateNow;
      }
    }
    else {
      QRegion::operator=(this_02,r);
    }
  }
  else {
    uVar2 = *(uint *)&(*(QWidgetPrivate **)&widget->field_0x8)->field_0x250;
    if ((uVar2 >> 0x18 & 1) == 0) {
      local_88 = QWidgetPrivate::effectiveRectFor(*(QWidgetPrivate **)&widget->field_0x8,&local_78);
      auVar3._8_8_ = 0;
      auVar3._0_4_ = local_a0.x2.m_i;
      auVar3._4_4_ = local_a0.y2.m_i;
      local_a0 = (QRect)(auVar3 << 0x40);
      local_90 = QWidget::mapTo(widget,*(QWidget **)this,(QPoint *)&local_a0);
      local_a0 = QRect::translated(&local_88,&local_90);
      QVar10 = QWidget::size(*(QWidget **)this);
      auVar4._4_4_ = QVar10.ht.m_i.m_i + -1;
      auVar4._0_4_ = QVar10.wd.m_i.m_i + -1;
      auVar4._8_8_ = 0;
      local_b0 = (QRect)(auVar4 << 0x40);
      local_a0 = (QRect)QRect::operator&(&local_a0,&local_b0);
      this_00 = this + 0x10;
      cVar6 = qt_region_strictContains((QRegion *)this_00,&local_a0);
      if (cVar6 == '\0') {
        if (bufferState == BufferInvalid) {
          bVar7 = QRegion::isEmpty();
          QVar1 = this[0x88];
          if ((*(QWidgetPrivate **)&widget->field_0x8)->graphicsEffect == (QGraphicsEffect *)0x0) {
            QRegion::translated((QRegion *)&local_b0,(QPoint *)r);
            QRegion::operator+=((QRegion *)this_00,(QRegion *)&local_b0);
            QRegion::~QRegion((QRegion *)&local_b0);
          }
          else {
            local_c0 = QWidgetPrivate::effectiveRectFor(*(QWidgetPrivate **)&widget->field_0x8,r);
            local_b0 = QRect::translated(&local_c0,&local_90);
            QRegion::operator+=((QRegion *)this_00,&local_b0);
          }
          if (updateTime != UpdateNow && (((byte)QVar1 ^ 1) & bVar7) == 0) goto LAB_00310635;
        }
        else {
          if (*(long *)(this + 0x28) != 0) {
            if ((*(byte *)(*(long *)&widget->field_0x8 + 0x252) & 8) == 0) {
              addDirtyWidget(this,widget,r);
            }
            else {
              cVar6 = qt_region_strictContains
                                ((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_88);
              if (cVar6 == '\0') {
                this_01 = *(QWidgetPrivate **)&widget->field_0x8;
                if (this_01->graphicsEffect == (QGraphicsEffect *)0x0) {
                  QRegion::operator+=(&this_01->dirty,r);
                }
                else {
                  local_b0 = QWidgetPrivate::effectiveRectFor(this_01,r);
                  QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_b0);
                }
              }
            }
            goto LAB_003104a6;
          }
          addDirtyWidget(this,widget,r);
        }
      }
      else {
LAB_003104a6:
        if (updateTime != UpdateNow) goto LAB_00310635;
        updateTime = UpdateNow;
      }
    }
    else {
      if ((uVar2 >> 0x13 & 1) == 0) {
        addDirtyRenderToTextureWidget(this,widget);
      }
      if ((updateTime != UpdateNow) && (this[0x88] != (QWidgetRepaintManager)0x0))
      goto LAB_00310635;
    }
    widget = *(QWidget **)this;
  }
  sendUpdateRequest(this,widget,updateTime);
LAB_00310635:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}